

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseSubstitution(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  long lVar11;
  bool bVar12;
  long lVar13;
  char *pcVar14;
  char cVar15;
  long *plVar16;
  State copy;
  
  pcVar1 = state->mangled_cur;
  if ((*pcVar1 == 'S') && (pcVar1[1] == '_')) {
    state->mangled_cur = pcVar1 + 2;
LAB_001125ce:
    MaybeAppend(state,"?");
LAB_0011267f:
    bVar12 = true;
  }
  else {
    pcVar2 = state->mangled_cur;
    pcVar3 = state->out_cur;
    pcVar4 = state->out_begin;
    pcVar5 = state->out_end;
    pcVar6 = state->prev_name;
    uVar7 = state->prev_name_length;
    uVar8 = state->nest_level;
    uVar9 = state->append;
    uVar10 = state->overflowed;
    pcVar1 = state->mangled_cur;
    if (*pcVar1 == 'S') {
      state->mangled_cur = pcVar1 + 1;
      lVar13 = 1;
      cVar15 = pcVar1[1];
      while ((cVar15 != '\0' && ((byte)(cVar15 - 0x30U) < 10 || (byte)(cVar15 + 0xbfU) < 0x1a))) {
        lVar11 = lVar13 + 1;
        lVar13 = lVar13 + 1;
        cVar15 = pcVar1[lVar11];
      }
      if (lVar13 != 1) {
        state->mangled_cur = pcVar1 + lVar13;
        if (pcVar1[lVar13] == '_') {
          state->mangled_cur = pcVar1 + lVar13 + 1;
          goto LAB_001125ce;
        }
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    pcVar1 = state->mangled_cur;
    if (*pcVar1 == 'S') {
      state->mangled_cur = pcVar1 + 1;
      pcVar14 = "St";
      plVar16 = (long *)(kSubstitutionList + 0x10);
      do {
        if (pcVar1[1] == pcVar14[1]) {
          MaybeAppend(state,"std");
          pcVar1 = (char *)plVar16[-1];
          if (*pcVar1 != '\0') {
            MaybeAppend(state,"::");
            MaybeAppend(state,pcVar1);
          }
          state->mangled_cur = state->mangled_cur + 1;
          goto LAB_0011267f;
        }
        pcVar14 = (char *)*plVar16;
        plVar16 = plVar16 + 2;
      } while (pcVar14 != (char *)0x0);
    }
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

static bool ParseSubstitution(State *state) {
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  *state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != NULL; ++p) {
      if (state->mangled_cur[0] == p->abbrev[1]) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->mangled_cur;
        return true;
      }
    }
  }
  *state = copy;
  return false;
}